

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O0

void __thiscall
amrex::BndryData::setBoundCond(BndryData *this,Orientation _face,int _n,int _comp,BoundCond *_bcn)

{
  Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_> *this_00;
  BoundCond *pBVar1;
  int *in_R8;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  Orientation local_4;
  
  this_00 = (Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_> *)
            LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  Orientation::operator_cast_to_int(&local_4);
  Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                *)this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  pBVar1 = Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>::operator[]
                     (this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  pBVar1->bctype = *in_R8;
  return;
}

Assistant:

void
BndryData::setBoundCond (Orientation     _face,
                         int              _n,
                         int              _comp,
                         const BoundCond& _bcn) noexcept
{
    bcond[_n][_face][_comp] = _bcn;
}